

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-vocab.cpp
# Opt level: O3

pair<const_char_*,_unsigned_long> __thiscall
naive_trie::get_longest_prefix(naive_trie *this,char *key,size_t len,size_t offset)

{
  char cVar1;
  undefined1 uVar2;
  size_t sVar3;
  _Base_ptr p_Var4;
  _Rb_tree_header *p_Var5;
  _Base_ptr p_Var6;
  pair<const_char_*,_unsigned_long> pVar7;
  
  sVar3 = offset;
  if (offset != len && len != 0) {
    while (offset = sVar3,
          p_Var6 = (this->children)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent,
          p_Var6 != (_Base_ptr)0x0) {
      cVar1 = key[offset];
      p_Var5 = &(this->children)._M_t._M_impl.super__Rb_tree_header;
      p_Var4 = &p_Var5->_M_header;
      do {
        uVar2 = (undefined1)p_Var6[1]._M_color;
        if (cVar1 <= (char)uVar2) {
          p_Var4 = p_Var6;
        }
        p_Var6 = (&p_Var6->_M_left)[(char)uVar2 < cVar1];
      } while (p_Var6 != (_Base_ptr)0x0);
      if (((_Rb_tree_header *)p_Var4 == p_Var5) || (cVar1 < (char)p_Var4[1]._M_color)) break;
      this = (naive_trie *)&p_Var4[1]._M_parent;
      sVar3 = offset + 1;
      offset = len;
      if (sVar3 == len) break;
    }
  }
  pVar7.second = offset;
  pVar7.first = key;
  return pVar7;
}

Assistant:

std::pair<const char *, size_t> get_longest_prefix(const char * key, size_t len, size_t offset = 0) const {
        if (len == 0 || offset == len) {
            return std::make_pair(key, offset);
        }
        char c = key[offset];
        auto res = children.find(c);
        if (res != children.end()) {
            return res->second.get_longest_prefix(key, len, offset + 1);
        }

        return std::make_pair(key, offset);
    }